

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O2

TreeNode * si9ma::BinaryTree::generate_node(string *str)

{
  bool bVar1;
  int value;
  TreeNode *this;
  
  bVar1 = std::operator==("#",str);
  if (bVar1) {
    this = (TreeNode *)0x0;
  }
  else {
    this = (TreeNode *)operator_new(0x20);
    value = std::__cxx11::stoi(str,(size_t *)0x0,10);
    TreeNode::TreeNode(this,value);
  }
  return this;
}

Assistant:

TreeNode* BinaryTree::generate_node(string str) {
        if ("#" == str)
            return nullptr;

        return new TreeNode(stoi(str));
    }